

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_number.cpp
# Opt level: O3

int ON_ParseAngleExpression
              (wchar_t *str,int str_count,ON_ParseSettings parse_settings,double *angle_value,
              ON_ParseSettings *parse_results,AngleUnitSystem *str_angle_unit_system)

{
  wchar_t *str_00;
  wchar_t wVar1;
  double dVar2;
  ON_ParseSettings parse_settings_00;
  ON_ParseSettings parse_settings_01;
  ON_ParseSettings parse_settings_02;
  ON_ParseSettings parse_settings_03;
  bool bVar3;
  ON__UINT32 aOVar4 [2];
  ON__UINT32 aOVar5 [2];
  undefined8 uVar6;
  ON__UINT16 OVar7;
  ON__UINT8 OVar8;
  ON__UINT8 OVar9;
  ON__UINT64 OVar10;
  undefined8 uVar11;
  bool bVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  undefined8 extraout_RAX;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  AngleUnitSystem *pAVar21;
  uint uVar22;
  ON_ParseSettings *pOVar23;
  byte bVar24;
  undefined4 uVar25;
  double dVar26;
  AngleUnitSystem angle_us;
  AngleUnitSystem next_us;
  double x;
  ON_ParseSettings input_parse_settings;
  ON_ParseSettings pr;
  double next_value;
  ON_ParseSettings pr1;
  ON_ParseSettings next_pr;
  AngleUnitSystem local_11e;
  AngleUnitSystem local_11d;
  uint local_11c;
  wchar_t *local_118;
  double local_110;
  double *local_108;
  int local_fc;
  ON_ParseSettings *local_f8;
  double local_f0;
  ON_ParseSettings local_e8;
  ON_ParseSettings local_c8;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  AngleUnitSystem *local_88;
  double local_80;
  ON_ParseSettings local_78;
  ON_ParseSettings local_58;
  
  OVar10 = ON_ParseSettings::FalseSettings.m_reserved;
  uVar6 = ON_ParseSettings::FalseSettings._16_8_;
  aOVar5 = ON_ParseSettings::FalseSettings.m_false_default_bits;
  aOVar4 = ON_ParseSettings::FalseSettings.m_true_default_bits;
  local_110 = -1.23432101234321e+308;
  local_11e = None;
  local_e8.m_reserved_bits = parse_settings.m_reserved_bits;
  local_e8.m_context_locale_id = parse_settings.m_context_locale_id;
  local_e8.m_context_angle_unit_system = parse_settings.m_context_angle_unit_system;
  local_e8.m_context_length_unit_system = parse_settings.m_context_length_unit_system;
  local_e8.m_reserved = parse_settings.m_reserved;
  local_e8.m_true_default_bits[0] = parse_settings.m_true_default_bits[0];
  local_e8.m_true_default_bits[1] = parse_settings.m_true_default_bits[1];
  local_e8.m_false_default_bits[0] = parse_settings.m_false_default_bits[0];
  local_e8.m_false_default_bits[1] = parse_settings.m_false_default_bits[1];
  local_c8._16_8_ = ON_ParseSettings::FalseSettings._16_8_;
  local_c8.m_reserved = ON_ParseSettings::FalseSettings.m_reserved;
  local_c8.m_true_default_bits = ON_ParseSettings::FalseSettings.m_true_default_bits;
  local_c8.m_false_default_bits = ON_ParseSettings::FalseSettings.m_false_default_bits;
  if (angle_value != (double *)0x0) {
    *angle_value = -1.23432101234321e+308;
  }
  if (str_angle_unit_system != (AngleUnitSystem *)0x0) {
    *str_angle_unit_system = None;
  }
  uVar11 = ON_ParseSettings::FalseSettings._16_8_;
  if (parse_results != (ON_ParseSettings *)0x0) {
    ON_ParseSettings::FalseSettings.m_reserved_bits = (ON__UINT32)uVar6;
    ON_ParseSettings::FalseSettings.m_context_locale_id = SUB82(uVar6,4);
    OVar7 = ON_ParseSettings::FalseSettings.m_context_locale_id;
    ON_ParseSettings::FalseSettings.m_context_angle_unit_system = SUB81(uVar6,6);
    OVar8 = ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
    ON_ParseSettings::FalseSettings.m_context_length_unit_system = SUB81(uVar6,7);
    OVar9 = ON_ParseSettings::FalseSettings.m_context_length_unit_system;
    parse_results->m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
    ON_ParseSettings::FalseSettings._16_8_ = uVar11;
    parse_results->m_context_locale_id = OVar7;
    parse_results->m_context_angle_unit_system = OVar8;
    parse_results->m_context_length_unit_system = OVar9;
    parse_results->m_reserved = OVar10;
    *&parse_results->m_true_default_bits = aOVar4;
    *&parse_results->m_false_default_bits = aOVar5;
  }
  local_108 = angle_value;
  bVar12 = ON_ParseSettings::ParseSurveyorsNotation(&local_e8);
  local_11c = str_count;
  local_118 = str;
  local_f8 = parse_results;
  local_88 = str_angle_unit_system;
  if (bVar12) {
    local_fc = 0;
    uVar19 = 0;
    if (0 < str_count || str_count == -1) {
      bVar12 = ON_ParseSettings::ParseLeadingWhiteSpace(&local_e8);
      uVar19 = 0;
      if (bVar12) {
        bVar12 = ON_ParseSettings::IsLeadingWhiteSpace(&local_e8,*str);
        uVar19 = 0;
        if (bVar12) {
          ON_ParseSettings::SetParseLeadingWhiteSpace(&local_c8,true);
          uVar19 = 0;
          if (0 < str_count) {
            uVar20 = 0;
            do {
              bVar12 = ON_ParseSettings::IsLeadingWhiteSpace(&local_e8,str[uVar20]);
              uVar19 = uVar20;
              if (!bVar12) break;
              uVar20 = uVar20 + 1;
              uVar19 = (ulong)(uint)str_count;
            } while ((uint)str_count != uVar20);
          }
        }
      }
    }
    iVar18 = (int)uVar19;
    ON_ParseSettings::SetParseLeadingWhiteSpace(&local_e8,false);
    bVar24 = 1;
    if ((str_count == -1) || (iVar18 + 3 <= str_count)) {
      wVar1 = str[uVar19 & 0xffffffff];
      iVar17 = 0x4e;
      if (wVar1 < L'n') {
        if (wVar1 != L'N') {
          if (wVar1 != L'S') goto LAB_00563b71;
LAB_00563b56:
          iVar17 = 0x53;
        }
      }
      else if (wVar1 != L'n') {
        if (wVar1 == L's') goto LAB_00563b56;
        goto LAB_00563b71;
      }
      iVar18 = iVar18 + 1;
      bVar24 = 0;
      ON_ParseSettings::SetParseIntegerDashFraction(&local_e8,false);
      local_fc = iVar17;
    }
LAB_00563b71:
    iVar17 = 0;
    if (0 < str_count) {
      iVar17 = iVar18;
    }
    local_78.m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
    local_78.m_context_locale_id = ON_ParseSettings::FalseSettings.m_context_locale_id;
    local_78.m_context_angle_unit_system =
         ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
    local_78.m_context_length_unit_system =
         ON_ParseSettings::FalseSettings.m_context_length_unit_system;
    local_78.m_reserved = ON_ParseSettings::FalseSettings.m_reserved;
    local_78.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_true_default_bits[0];
    local_78.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
    local_78.m_false_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0];
    local_78.m_false_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1];
    str_00 = local_118 + iVar18;
    parse_settings_01.m_false_default_bits[0] = local_e8.m_false_default_bits[0];
    parse_settings_01.m_false_default_bits[1] = local_e8.m_false_default_bits[1];
    parse_settings_01.m_true_default_bits[0] = local_e8.m_true_default_bits[0];
    parse_settings_01.m_true_default_bits[1] = local_e8.m_true_default_bits[1];
    parse_settings_01.m_reserved_bits = local_e8.m_reserved_bits;
    parse_settings_01.m_context_locale_id = local_e8.m_context_locale_id;
    parse_settings_01.m_context_angle_unit_system = local_e8.m_context_angle_unit_system;
    parse_settings_01.m_context_length_unit_system = local_e8.m_context_length_unit_system;
    parse_settings_01.m_reserved = local_e8.m_reserved;
    uVar14 = ON_ParseNumberExpression
                       (str_00,str_count - iVar17,parse_settings_01,&local_78,&local_110);
    if ((int)uVar14 < 1) {
      bVar13 = ON_ParseSettings::ParseScientificENotation(&local_e8);
      bVar12 = false;
      uVar14 = 0;
      if (bVar13) {
        ON_ParseSettings::SetParseScientificENotation(&local_e8,false);
        parse_settings_02.m_false_default_bits[0] = local_e8.m_false_default_bits[0];
        parse_settings_02.m_false_default_bits[1] = local_e8.m_false_default_bits[1];
        parse_settings_02.m_true_default_bits[0] = local_e8.m_true_default_bits[0];
        parse_settings_02.m_true_default_bits[1] = local_e8.m_true_default_bits[1];
        parse_settings_02.m_reserved_bits = local_e8.m_reserved_bits;
        parse_settings_02.m_context_locale_id = local_e8.m_context_locale_id;
        parse_settings_02.m_context_angle_unit_system = local_e8.m_context_angle_unit_system;
        parse_settings_02.m_context_length_unit_system = local_e8.m_context_length_unit_system;
        parse_settings_02.m_reserved = local_e8.m_reserved;
        uVar14 = ON_ParseNumberExpression
                           (str_00,str_count - iVar17,parse_settings_02,&local_c8,&local_110);
        if ((int)uVar14 < 1) {
          return 0;
        }
        if ((local_118[uVar14] | 0x20U) != 0x65) {
          return 0;
        }
        bVar12 = false;
      }
    }
    else {
      if ((bool)(bVar24 & local_110 <= 0.0)) {
        bVar12 = Internal_IsNegativeInteger(&local_e8,str_00,uVar14 - iVar18);
      }
      else {
        bVar12 = false;
      }
      ON_ParseSettings::operator|=(&local_c8,&local_78);
    }
    uVar14 = uVar14 + iVar18;
    str = local_118;
  }
  else {
    parse_settings_00.m_false_default_bits[0] = local_e8.m_false_default_bits[0];
    parse_settings_00.m_false_default_bits[1] = local_e8.m_false_default_bits[1];
    parse_settings_00.m_true_default_bits[0] = local_e8.m_true_default_bits[0];
    parse_settings_00.m_true_default_bits[1] = local_e8.m_true_default_bits[1];
    parse_settings_00.m_reserved_bits = local_e8.m_reserved_bits;
    parse_settings_00.m_context_locale_id = local_e8.m_context_locale_id;
    parse_settings_00.m_context_angle_unit_system = local_e8.m_context_angle_unit_system;
    parse_settings_00.m_context_length_unit_system = local_e8.m_context_length_unit_system;
    parse_settings_00.m_reserved = local_e8.m_reserved;
    uVar14 = ON_ParseNumberExpression(str,str_count,parse_settings_00,&local_c8,&local_110);
    if ((int)uVar14 < 1) {
      return 0;
    }
    local_fc = 0;
    if (local_110 <= 0.0) {
      bVar12 = Internal_IsNegativeInteger(&local_e8,str,uVar14);
    }
    else {
      bVar12 = false;
    }
  }
  uVar22 = local_11c;
  if ((0 < (int)local_11c) && (uVar22 = local_11c - uVar14, (int)local_11c < (int)uVar14)) {
    return 0;
  }
  uVar19 = (ulong)uVar14;
  local_11c = uVar22;
  uVar15 = ON_ParseSettings::PreferedLocaleId(&parse_settings);
  uVar22 = local_11c;
  uVar15 = ON_ParseAngleUnitName(str + (int)uVar14,local_11c,uVar15,&local_11e);
  pAVar21 = local_88;
  pOVar23 = local_f8;
  iVar18 = local_fc;
  bVar13 = false;
  if (local_11e == Degrees) {
    bVar13 = bVar12;
  }
  if (bVar12 == false) {
    bVar13 = bVar12;
  }
  if ((int)uVar15 < 1) {
    local_11e = ON_ParseSettings::DefaultAngleUnitSystem(&parse_settings);
    pAVar21 = local_88;
    pOVar23 = local_f8;
    iVar18 = local_fc;
  }
  else {
    if ((0 < (int)uVar22) && (local_11c = uVar22 - uVar15, uVar22 < uVar15)) {
      return 0;
    }
    uVar15 = uVar15 + uVar14;
    if (local_11c == 0xffffffff) {
      if (local_11e == Degrees) goto LAB_00563da5;
      local_11c = 0xffffffff;
    }
    else if ((int)(uVar15 + 1) < (int)local_11c && local_11e == Degrees) {
LAB_00563da5:
      local_f0 = local_110;
      dVar26 = floor(local_110);
      if ((((((dVar26 == local_f0) && (!NAN(dVar26) && !NAN(local_f0))) &&
            (bVar12 = ON_ParseSettings::ParseArcDegreesMinutesSeconds(&local_e8), bVar12)) &&
           ((bVar12 = ON_ParseSettings::ParseSignificandDecimalPoint(&local_c8), !bVar12 &&
            (bVar12 = ON_ParseSettings::ParseScientificENotation(&local_c8), !bVar12)))) &&
          ((bVar12 = ON_ParseSettings::ParseRationalNumber(&local_c8), !bVar12 &&
           ((bVar12 = ON_ParseSettings::ParsePi(&local_c8), !bVar12 &&
            (bVar12 = ON_ParseSettings::ParseDivision(&local_c8), !bVar12)))))) &&
         ((bVar12 = ON_ParseSettings::ParseMultiplication(&local_c8), !bVar12 &&
          (bVar12 = ON_ParseSettings::ParseIntegerDashFraction(&local_c8), !bVar12)))) {
        local_78.m_reserved_bits = local_e8.m_reserved_bits;
        local_78.m_context_locale_id = local_e8.m_context_locale_id;
        local_78.m_context_angle_unit_system = local_e8.m_context_angle_unit_system;
        local_78.m_context_length_unit_system = local_e8.m_context_length_unit_system;
        local_78.m_reserved = local_e8.m_reserved;
        local_78.m_true_default_bits[0] = local_e8.m_true_default_bits[0];
        local_78.m_true_default_bits[1] = local_e8.m_true_default_bits[1];
        local_78.m_false_default_bits[0] = local_e8.m_false_default_bits[0];
        local_78.m_false_default_bits[1] = local_e8.m_false_default_bits[1];
        local_f8 = pOVar23;
        DisableStartAndExpressionParsingStuff(&local_78);
        ON_ParseSettings::SetParseSignificandDigitSeparators(&local_78,false);
        ON_ParseSettings::SetParseIntegerDashFraction(&local_78,false);
        ON_ParseSettings::SetParseRationalNumber(&local_78,false);
        ON_ParseSettings::SetParsePi(&local_78,false);
        ON_ParseSettings::SetParseSurveyorsNotation(&local_78,false);
        ON_ParseSettings::SetParseUnaryMinus(&local_78,false);
        ON_ParseSettings::SetParseUnaryPlus(&local_78,false);
        local_f0 = (double)CONCAT44(local_f0._4_4_,(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1)
                                   );
        local_98 = 0.0;
        uStack_90 = 0;
        local_a8 = 0;
        uStack_a4 = 0;
        uStack_a0 = 0;
        while( true ) {
          iVar18 = ~uVar15 + local_11c;
          local_80 = -1.23432101234321e+308;
          local_11d = None;
          local_58.m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
          local_58.m_context_locale_id = ON_ParseSettings::FalseSettings.m_context_locale_id;
          local_58.m_context_angle_unit_system =
               ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
          local_58.m_context_length_unit_system =
               ON_ParseSettings::FalseSettings.m_context_length_unit_system;
          local_58.m_reserved = ON_ParseSettings::FalseSettings.m_reserved;
          local_58.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_true_default_bits[0];
          local_58.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
          local_58.m_false_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0]
          ;
          local_58.m_false_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1]
          ;
          if (local_11c == 0xffffffff) {
            iVar18 = -1;
          }
          parse_settings_03.m_false_default_bits[0] = local_78.m_false_default_bits[0];
          parse_settings_03.m_false_default_bits[1] = local_78.m_false_default_bits[1];
          parse_settings_03.m_true_default_bits[0] = local_78.m_true_default_bits[0];
          parse_settings_03.m_true_default_bits[1] = local_78.m_true_default_bits[1];
          parse_settings_03.m_reserved_bits = local_78.m_reserved_bits;
          parse_settings_03.m_context_locale_id = local_78.m_context_locale_id;
          parse_settings_03.m_context_angle_unit_system = local_78.m_context_angle_unit_system;
          parse_settings_03.m_context_length_unit_system = local_78.m_context_length_unit_system;
          parse_settings_03.m_reserved = local_78.m_reserved;
          iVar18 = ON_ParseAngleExpression
                             (local_118 + (int)uVar15,iVar18,parse_settings_03,&local_80,&local_58,
                              &local_11d);
          bVar12 = bVar13;
          if (iVar18 < 1) break;
          bVar12 = false;
          if ((local_80 < 0.0) || (bVar12 = false, 60.0 <= local_80)) break;
          if ((((ulong)local_f0 & 1) == 0) || (bVar3 = true, local_11d != Minutes)) {
            bVar3 = false;
            bVar12 = false;
            if (local_11d != Seconds) break;
            local_98 = local_80;
            uStack_90 = 0;
          }
          else {
            local_a8 = SUB84(local_80,0);
            uStack_a4 = (undefined4)((ulong)local_80 >> 0x20);
            uStack_a0 = 0;
          }
          uVar15 = iVar18 + uVar15;
          ON_ParseSettings::SetParseArcDegreesMinutesSeconds(&local_c8,true);
          ON_ParseSettings::operator|=(&local_c8,&local_58);
          local_f0 = (double)((ulong)local_f0 & 0xffffffff00000000);
          bVar12 = bVar13;
          if (!bVar3) break;
        }
        uVar19 = (ulong)uVar15;
        uVar25 = uStack_a4;
        dVar26 = local_98;
        if ((((bVar12 != false) && (local_110 <= 0.0)) &&
            (0.0 <= (double)CONCAT44(uStack_a4,local_a8))) && (0.0 <= local_98)) {
          dVar2 = -(double)CONCAT44(uStack_a4,local_a8);
          uVar25 = (int)((ulong)dVar2 >> 0x20);
          if ((double)CONCAT44(uStack_a4,local_a8) <= dVar2) {
            uVar25 = uStack_a4;
          }
          if (0.0 < local_98) {
            dVar26 = -local_98;
          }
        }
        iVar18 = local_fc;
        pOVar23 = local_f8;
        if ((dVar26 != 0.0) || (NAN(dVar26))) {
          local_110 = (local_110 * 60.0 + (double)CONCAT44(uVar25,local_a8)) * 60.0 + dVar26;
          local_11e = Seconds;
        }
        else if (((double)CONCAT44(uVar25,local_a8) != 0.0) ||
                (NAN((double)CONCAT44(uVar25,local_a8)))) {
          local_110 = local_110 * 60.0 + (double)CONCAT44(uVar25,local_a8);
          local_11e = Minutes;
        }
        goto LAB_00563e5d;
      }
    }
    uVar19 = (ulong)uVar15;
  }
LAB_00563e5d:
  iVar17 = (int)uVar19;
  if ((iVar18 == 0) || (iVar17 < 1)) goto LAB_00563f6a;
  if ((0 < (int)local_11c) && ((int)local_11c <= iVar17)) {
    return 0;
  }
  wVar1 = local_118[uVar19];
  iVar16 = 0x45;
  if (wVar1 < L'e') {
    if (wVar1 != L'E') {
      if (wVar1 != L'W') {
        return 0;
      }
LAB_00563eac:
      iVar16 = 0x57;
    }
  }
  else if (wVar1 != L'e') {
    if (wVar1 != L'w') {
      return 0;
    }
    goto LAB_00563eac;
  }
  if (local_11e == None) {
    local_11e = Degrees;
  }
  iVar17 = iVar17 + 1;
  dVar26 = ON::AngleUnitScale(Turns,local_11e);
  dVar26 = dVar26 * 0.25;
  if (iVar18 == 0x53) {
    if (iVar16 == 0x57) {
      local_110 = -(dVar26 + local_110);
    }
    else {
      if (iVar16 != 0x45) {
        return 0;
      }
      local_110 = -(dVar26 - local_110);
    }
  }
  else {
    if (iVar18 != 0x4e) {
      return 0;
    }
    if (iVar16 == 0x57) {
      local_110 = dVar26 + local_110;
    }
    else {
      if (iVar16 != 0x45) {
        return 0;
      }
      local_110 = dVar26 - local_110;
    }
  }
LAB_00563f6a:
  if (local_108 != (double *)0x0) {
    *local_108 = local_110;
  }
  if (pOVar23 != (ON_ParseSettings *)0x0) {
    pOVar23->m_reserved_bits = local_c8.m_reserved_bits;
    pOVar23->m_context_locale_id = local_c8.m_context_locale_id;
    pOVar23->m_context_angle_unit_system = local_c8.m_context_angle_unit_system;
    pOVar23->m_context_length_unit_system = local_c8.m_context_length_unit_system;
    pOVar23->m_reserved = local_c8.m_reserved;
    *&pOVar23->m_true_default_bits = local_c8.m_true_default_bits;
    *&pOVar23->m_false_default_bits = local_c8.m_false_default_bits;
  }
  if (pAVar21 != (AngleUnitSystem *)0x0) {
    *pAVar21 = local_11e;
    return iVar17;
  }
  return iVar17;
}

Assistant:

int ON_ParseAngleExpression( 
  const wchar_t* str,
  int str_count,
  ON_ParseSettings parse_settings,
  double* angle_value,
  ON_ParseSettings* parse_results,
  ON::AngleUnitSystem* str_angle_unit_system
  )
{
  double x = ON_UNSET_VALUE;
  ON::AngleUnitSystem angle_us = ON::AngleUnitSystem::None;
  ON_ParseSettings input_parse_settings(parse_settings);
  ON_ParseSettings pr = ON_ParseSettings::FalseSettings;
  if ( 0 != angle_value )
    *angle_value = ON_UNSET_VALUE;
  if ( 0 != str_angle_unit_system )
    *str_angle_unit_system = angle_us;
  if ( 0 != parse_results )
    *parse_results = pr;

  bool bNegativeDegreesMinutesSecondsIsPossible = false;
  int str_index = 0;
  ON__UINT32 cSurveyorsNotationNS = 0;
  ON__UINT32 cSurveyorsNotationEW = 0;
  if ( input_parse_settings.ParseSurveyorsNotation() )
  {
    if (    (str_index < str_count || -1 == str_count)
         && input_parse_settings.ParseLeadingWhiteSpace() 
         && input_parse_settings.IsLeadingWhiteSpace(str[str_index])
       )
    {
      // skip over leading white space
      pr.SetParseLeadingWhiteSpace(true);
      while ( str_index < str_count && input_parse_settings.IsLeadingWhiteSpace(str[str_index]) )
      {
        str_index++;
      }
    }

    input_parse_settings.SetParseLeadingWhiteSpace(false);

    if ( ((str_index+3 <= str_count) || -1 == str_count) )
    {
      // Do not localize "N" or "n" or "S" or "s".  
      // These letters are specified by Surveyor's notation specification.
      // [TODO - Reference needed].
      switch(str[str_index])
      {
      case 'N': // Do not localize this letter
      case 'n': // Do not localize this letter
        str_index++;
        cSurveyorsNotationNS = 'N';
        break;
      case 'S': // Do not localize this letter
      case 's': // Do not localize this letter
        str_index++;
        cSurveyorsNotationNS = 'S';
        break;
      }
    }

    if ( 0 != cSurveyorsNotationNS )
    {
      input_parse_settings.SetParseIntegerDashFraction(false);
    }

    const int str_number_count = (str_count > 0 ? str_count-str_index : str_count);
    ON_ParseSettings pr1(ON_ParseSettings::FalseSettings);
    int str_number_index = ON_ParseNumberExpression(str+str_index,str_number_count,input_parse_settings,&pr1,&x);
    if ( str_number_index > 0 )
    {
      if (0 == cSurveyorsNotationNS && x <= 0.0 && Internal_IsNegativeInteger(input_parse_settings, str + str_index, str_number_index - str_index))
        bNegativeDegreesMinutesSecondsIsPossible = true;
      pr |= pr1;
    }
    else
    {
      if ( input_parse_settings.ParseScientificENotation() )
      {
        // It may be that the string looked like N15.23E and the number parser failed
        // because 15.23E is an invalid attempt at using scientific E notation.
        input_parse_settings.SetParseScientificENotation(false);
        str_number_index = ON_ParseNumberExpression(str+str_index,str_number_count,input_parse_settings,&pr,&x);
        if ( str_number_index <= 0 )
          return 0;
        if ( 'E' != str[str_number_index] && 'e' != str[str_number_index] )
          return 0;
      }
    }
    str_index += str_number_index;
  }
  else
  {
    str_index = ON_ParseNumberExpression(str,str_count,input_parse_settings,&pr,&x);
    if ( str_index <= 0 )
      return 0;
    if (0 == cSurveyorsNotationNS && x <= 0.0 && Internal_IsNegativeInteger(input_parse_settings, str, str_index))
      bNegativeDegreesMinutesSecondsIsPossible = true;
  }

  if ( str_count > 0 )
  {
    if (str_index > str_count )
      return 0;
    str_count -= str_index;
  }

  int end_of_unit_index = ON_ParseAngleUnitName(str+str_index,str_count,parse_settings.PreferedLocaleId(),&angle_us);

  if (bNegativeDegreesMinutesSecondsIsPossible && ON::AngleUnitSystem::Degrees != angle_us)
    bNegativeDegreesMinutesSecondsIsPossible = false;

  if ( end_of_unit_index > 0 )
  {
    if ( str_count > 0 )
    {
      if (end_of_unit_index > str_count )
        return 0;
      str_count -= end_of_unit_index;
    }
    str_index += end_of_unit_index;

    if ( -1 == str_count || str_index+1 < str_count )
    {
      if ( ON::AngleUnitSystem::Degrees == angle_us 
           && floor(x) == x
           && input_parse_settings.ParseArcDegreesMinutesSeconds() 
           && false == pr.ParseSignificandDecimalPoint()
           && false == pr.ParseScientificENotation()
           && false == pr.ParseRationalNumber()
           && false == pr.ParsePi()
           && false == pr.ParseDivision()
           && false == pr.ParseMultiplication()
           && false == pr.ParseIntegerDashFraction()
         )
      {
        // parse arc minutes
        ON_ParseSettings next_parse_settings = input_parse_settings;
        DisableStartAndExpressionParsingStuff(next_parse_settings);
        next_parse_settings.SetParseSignificandDigitSeparators(false);
        next_parse_settings.SetParseIntegerDashFraction(false);
        next_parse_settings.SetParseRationalNumber(false);
        next_parse_settings.SetParsePi(false);
        next_parse_settings.SetParseSurveyorsNotation(false);
        next_parse_settings.SetParseUnaryMinus(false);
        next_parse_settings.SetParseUnaryPlus(false);

        double arc_minutes_value = 0.0;
        double arc_seconds_value = 0.0;

        for ( int next_value_pass = 0; next_value_pass < 2; next_value_pass++ )
        {
          double next_value = ON_UNSET_VALUE;
          ON::AngleUnitSystem next_us(ON::AngleUnitSystem::None);
          ON_ParseSettings next_pr(ON_ParseSettings::FalseSettings);
          int next_str_index = ON_ParseAngleExpression(
            str+str_index,
            ((-1 == str_count) ? str_count : (str_count-str_index-1)),
            next_parse_settings,&next_value,&next_pr,&next_us);

          if ( next_str_index <= 0 )
            break;

          if (!(next_value >= 0.0 && next_value < 60.0))
          {
            bNegativeDegreesMinutesSecondsIsPossible = false;
            break;
          }

          if ( 0 == next_value_pass )
          {
            if ( ON::AngleUnitSystem::Minutes != next_us )
            {
              if ( ON::AngleUnitSystem::Seconds == next_us && 0 == next_value_pass )
                next_value_pass = 1;
              else
              {
                bNegativeDegreesMinutesSecondsIsPossible = false;
                break;
              }
            }
          }
          else if ( 1 == next_value_pass )
          {
            if (ON::AngleUnitSystem::Seconds != next_us)
            {
              bNegativeDegreesMinutesSecondsIsPossible = false;              
              break;
            }
          }

          if (ON::AngleUnitSystem::Minutes == next_us)
            arc_minutes_value = next_value;
          else if (ON::AngleUnitSystem::Seconds == next_us)
            arc_seconds_value = next_value;
          else
            bNegativeDegreesMinutesSecondsIsPossible = false;

          str_index += next_str_index;
          pr.SetParseArcDegreesMinutesSeconds(true);
          pr |= next_pr;
        }

        if (
          bNegativeDegreesMinutesSecondsIsPossible
          && x <= 0.0 
          && arc_minutes_value >= 0.0 
          && arc_seconds_value >= 0.0
          )
        {
          // parsing something like -90d40'30"
          if (arc_minutes_value > 0.0)
            arc_minutes_value = -arc_minutes_value;
          if (arc_seconds_value > 0.0)
            arc_seconds_value = -arc_seconds_value;
        }

        if ( 0 != arc_seconds_value )
        {
          x = 60.0*(60.0*x + arc_minutes_value) + arc_seconds_value;
          angle_us = ON::AngleUnitSystem::Seconds;
        }
        else if ( 0 != arc_minutes_value )
        {
          x = 60.0*x + arc_minutes_value;
          angle_us = ON::AngleUnitSystem::Minutes;
        }
      }
    }
  }
  else
  {
    bNegativeDegreesMinutesSecondsIsPossible = false;
    angle_us = parse_settings.DefaultAngleUnitSystem();
  }

  if ( str_index > 0 && 0 != cSurveyorsNotationNS )
  {
    if ( str_count > 0 )
    {
      if (str_index+1 > str_count )
        return 0;
    }

    // Do not localize "E" or "e" or "W" or "w".  
    // These letters are specified by Surveyor's notation specification.
    // [TODO - Reference needed].
    switch(str[str_index])
    {
    case 'E': // Do not localize this letter
    case 'e': // Do not localize this letter
      str_index++;
      cSurveyorsNotationEW = 'E';
      break;
    case 'W': // Do not localize this letter
    case 'w': // Do not localize this letter
      str_index++;
      cSurveyorsNotationEW = 'W';
      break;
    default:
      cSurveyorsNotationEW = 0;
      break;
    }

    if (0 == cSurveyorsNotationEW )
      return 0;

    if ( ON::AngleUnitSystem::None == angle_us )
    {
      // Surveyor's notation implies degrees when no angle unit
      // is explicitly supplied.  This is done because it is
      // difficult for many users to enter a degree symbol
      // when typing input and Surveyor's notation is almost
      // always in degrees. [TODO cite reference].
      angle_us = ON::AngleUnitSystem::Degrees;
    }

    // The value of right_angle is calculated this way because it will
    // yield the most precise result in all angle unit systems since
    // IEEE double multiplication by 0.25 is exact and the value
    // returned by ON::AngleUnitScale(ON::turns,angle_us) is exact 
    // for all supported angle units except radians where pi rounded
    // because the IEEE double must approximate the value of pi.
    const double right_angle = 0.25*ON::AngleUnitScale(ON::AngleUnitSystem::Turns,angle_us);

    switch(cSurveyorsNotationNS)
    {
    case 'N':
      switch(cSurveyorsNotationEW)
      {
      case 'E': // N<angle>E
        x = right_angle - x;
        break;
      case 'W': // N<angle>W
        x = right_angle + x;
        break;
      default:
        return 0;
      }
      break;
    case 'S':
      switch(cSurveyorsNotationEW)
      {
      case 'E': // S<angle>E
        x =  -(right_angle - x);
        break;
      case 'W': // S<angle>W
        x =  -(right_angle + x);
        break;
      default:
        return 0;
      }
      break;
    default:
      return 0;
    }
  }

  if ( angle_value )
    *angle_value = x;
  if ( 0 != parse_results )
    *parse_results = pr;
  if ( 0 != str_angle_unit_system )
    *str_angle_unit_system = angle_us;

  return str_index;
}